

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O2

void arg_print_glossary_ds(arg_dstr_t ds,void **argtable,char *format)

{
  byte *pbVar1;
  undefined8 uVar2;
  char *fmt;
  char syntax [200];
  char *in_stack_ffffffffffffff08;
  
  fmt = "  %-20s %s\n";
  if (format != (char *)0x0) {
    fmt = format;
  }
  for (; pbVar1 = (byte *)*argtable, (*pbVar1 & 1) == 0; argtable = argtable + 1) {
    if (*(long *)(pbVar1 + 0x20) != 0) {
      memset(&stack0xffffffffffffff08,0,200);
      uVar2 = *(undefined8 *)(pbVar1 + 0x20);
      arg_cat_optionv(&stack0xffffffffffffff08,*(size_t *)(pbVar1 + 8),*(char **)(pbVar1 + 0x10),
                      *(char **)(pbVar1 + 0x18),(char *)(ulong)(*pbVar1 & 4),0x1107b6,
                      in_stack_ffffffffffffff08);
      arg_dstr_catf(ds,fmt,&stack0xffffffffffffff08,uVar2);
    }
  }
  return;
}

Assistant:

void arg_print_glossary_ds(arg_dstr_t ds, void** argtable, const char* format) {
    struct arg_hdr** table = (struct arg_hdr**)argtable;
    int tabindex;

    format = format ? format : "  %-20s %s\n";
    for (tabindex = 0; !(table[tabindex]->flag & ARG_TERMINATOR); tabindex++) {
        if (table[tabindex]->glossary) {
            char syntax[200] = "";
            const char* shortopts = table[tabindex]->shortopts;
            const char* longopts = table[tabindex]->longopts;
            const char* datatype = table[tabindex]->datatype;
            const char* glossary = table[tabindex]->glossary;
            arg_cat_optionv(syntax, sizeof(syntax) - 1, shortopts, longopts, datatype, table[tabindex]->flag & ARG_HASOPTVALUE, ", ");
            arg_dstr_catf(ds, format, syntax, glossary);
        }
    }
}